

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9250::setGyroFsr(RTIMUMPU9250 *this,uchar fsr)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,fsr);
  switch(uVar1 << 0x1d | uVar1 >> 3) {
  case 0:
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.00013323124;
    break;
  case 1:
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.00027925268;
    break;
  case 2:
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.00053211255;
    break;
  case 3:
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.0010642251;
    break;
  default:
    fprintf(_stderr,"Illegal MPU9250 gyro fsr %d\n");
    return false;
  }
  return true;
}

Assistant:

bool RTIMUMPU9250::setGyroFsr(unsigned char fsr)
{
    switch (fsr) {
    case MPU9250_GYROFSR_250:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (131.0 * 180.0);
        return true;

    case MPU9250_GYROFSR_500:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (62.5 * 180.0);
        return true;

    case MPU9250_GYROFSR_1000:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (32.8 * 180.0);
        return true;

    case MPU9250_GYROFSR_2000:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (16.4 * 180.0);
        return true;

    default:
        HAL_ERROR1("Illegal MPU9250 gyro fsr %d\n", fsr);
        return false;
    }
}